

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O0

string * anon_unknown.dwarf_2acd2d::replaceIfContains
                   (string *input,string *pattern,
                   function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                   *replacer)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_RSI;
  string *in_RDI;
  string *replaceWith;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [64];
  
  replaceWith = in_RDI;
  bVar1 = ApprovalTests::StringUtils::contains(in_RDX,in_RCX);
  if (bVar1) {
    std::__cxx11::string::string(local_40,(string *)in_RSI);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(in_RSI);
    ApprovalTests::StringUtils::replaceAll
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(string *)replaceWith);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)in_RSI);
  }
  return replaceWith;
}

Assistant:

std::string replaceIfContains(std::string input,
                                  std::string pattern,
                                  std::function<std::string(void)> replacer)
    {
        if (!ApprovalTests::StringUtils::contains(input, pattern))
        {
            return input;
        }
        return ApprovalTests::StringUtils::replaceAll(input, pattern, replacer());
    }